

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UnscentedKalmanFilter.cpp
# Opt level: O1

void __thiscall
UnscentedKalmanFilter::UpdateState
          (UnscentedKalmanFilter *this,VectorXd *z,VectorXd *z_pred,MatrixXd *S,MatrixXd *Xsig_pred,
          MatrixXd *Zsig,VectorXd *x,MatrixXd *P)

{
  double *pdVar1;
  double **ppdVar2;
  DenseStorage<double,__1,__1,__1,_0> *pDVar3;
  double dVar4;
  uint uVar5;
  uint uVar6;
  long lVar7;
  double *pdVar8;
  double *pdVar9;
  undefined1 auVar10 [16];
  double dVar11;
  Index size;
  DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *other;
  PlainObject *pPVar12;
  ostream *poVar13;
  undefined8 *puVar14;
  long lVar15;
  ulong uVar16;
  PlainObject *pPVar17;
  ulong uVar18;
  char *pcVar19;
  long lVar20;
  long lVar21;
  MatrixXd K;
  VectorXd z_diff;
  MatrixXd Tc;
  VectorXd x_diff;
  EigenSolver<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> es;
  long local_1d0;
  DenseStorage<double,__1,__1,__1,_0> local_1c8;
  LhsNested local_1b0;
  undefined1 local_1a8 [16];
  DenseStorage<double,__1,__1,__1,_0> local_198;
  DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *local_178;
  DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *local_170;
  DenseStorage<double,__1,__1,__1,_0> local_168;
  GeneralProduct<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_5>
  local_150;
  DenseStorage<double,__1,__1,__1,_0> *local_128;
  undefined1 local_120 [24];
  complex<double> *pcStack_108;
  double *pdStack_100;
  DenseIndex local_f8;
  double *local_f0;
  double *local_d8;
  double *local_c0;
  double *local_b0;
  double *local_98;
  double *local_88;
  double *local_60;
  double *local_48;
  Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> local_38;
  
  uVar5 = (uint)(z_pred->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                m_rows;
  uVar6 = (uint)(x->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows
  ;
  local_198.m_data = (double *)0x0;
  local_198.m_rows = 0;
  local_198.m_cols = 0;
  lVar21 = (long)(int)uVar6;
  lVar15 = (long)(int)uVar5;
  local_178 = (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)Xsig_pred;
  local_170 = (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)Zsig;
  if ((long)(int)(uVar6 | uVar5) < 0) {
    __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (nbRows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (nbCols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (nbRows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (nbCols<=MaxColsAtCompileTime)) && nbRows>=0 && nbCols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/overtane[P]udacity-carnd-p7/src/Eigen/src/Core/PlainObjectBase.h"
                  ,0xf1,
                  "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, -1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, -1, -1>]"
                 );
  }
  if ((uVar5 != 0 && uVar6 != 0) &&
     (auVar10 = ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff),
     SUB168(auVar10 / SEXT816(lVar15),0) < lVar21)) {
    puVar14 = (undefined8 *)
              __cxa_allocate_exception
                        (8,(long)(int)(uVar6 | uVar5),SUB168(auVar10 % SEXT816(lVar15),0));
    *puVar14 = operator_delete;
    __cxa_throw(puVar14,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
            ((DenseStorage<double,__1,__1,__1,_0> *)(local_1a8 + 0x10),lVar21 * lVar15,lVar21,lVar15
            );
  local_120._0_8_ = local_198.m_rows;
  local_120._8_8_ = local_198.m_cols;
  local_120._16_8_ = (DenseStorage<double,__1,__1,__1,_0> *)0x0;
  local_128 = (DenseStorage<double,__1,__1,__1,_0> *)S;
  if ((local_198.m_cols | local_198.m_rows) < 0) {
    __assert_fail("nbRows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == nbRows) && nbCols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == nbCols)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/overtane[P]udacity-carnd-p7/src/Eigen/src/Core/CwiseNullaryOp.h"
                  ,0x3f,
                  "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, -1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, -1>]"
                 );
  }
  pDVar3 = (DenseStorage<double,__1,__1,__1,_0> *)(local_1a8 + 0x10);
  local_1b0 = (LhsNested)z;
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  lazyAssign<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)pDVar3,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
              *)local_120);
  if (0 < this->n_sigma_) {
    local_1d0 = 0;
    lVar15 = 0;
    do {
      lVar21 = *(long *)local_170;
      lVar7 = *(long *)(local_170 + 8);
      if ((lVar7 < 0) && (lVar21 + lVar7 * lVar15 * 8 != 0)) {
LAB_0011df14:
        __assert_fail("(dataPtr == 0) || ( nbRows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == nbRows) && nbCols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == nbCols))"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/overtane[P]udacity-carnd-p7/src/Eigen/src/Core/MapBase.h"
                      ,0x94,
                      "Eigen::MapBase<Eigen::Block<const Eigen::Matrix<double, -1, -1>, -1, 1, true>>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<const Eigen::Matrix<double, -1, -1>, -1, 1, true>, Level = 0]"
                     );
      }
      if (*(long *)(local_170 + 0x10) <= lVar15) {
LAB_0011def5:
        __assert_fail("(i>=0) && ( ((BlockRows==1) && (BlockCols==XprType::ColsAtCompileTime) && i<xpr.rows()) ||((BlockRows==XprType::RowsAtCompileTime) && (BlockCols==1) && i<xpr.cols()))"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/overtane[P]udacity-carnd-p7/src/Eigen/src/Core/Block.h"
                      ,0x76,
                      "Eigen::Block<const Eigen::Matrix<double, -1, -1>, -1, 1, true>::Block(XprType &, Index) [XprType = const Eigen::Matrix<double, -1, -1>, BlockRows = -1, BlockCols = 1, InnerPanel = true]"
                     );
      }
      lVar20 = (z_pred->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
               m_rows;
      if (lVar7 != lVar20) {
LAB_0011dede:
        pcVar19 = 
        "Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Block<const Eigen::Matrix<double, -1, -1>, -1, 1, true>, const Eigen::Matrix<double, -1, 1>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_difference_op<double>, Lhs = const Eigen::Block<const Eigen::Matrix<double, -1, -1>, -1, 1, true>, Rhs = const Eigen::Matrix<double, -1, 1>]"
        ;
        goto LAB_0011df48;
      }
      Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage
                ((DenseStorage<double,__1,__1,_1,_0> *)&local_1c8,lVar20,lVar20,1);
      Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_1c8,
                 (z_pred->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                 m_rows,1);
      if (local_1c8.m_rows !=
          (z_pred->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows)
      {
LAB_0011df52:
        pcVar19 = 
        "Derived &Eigen::DenseBase<Eigen::Matrix<double, -1, 1>>::lazyAssign(const DenseBase<OtherDerived> &) [Derived = Eigen::Matrix<double, -1, 1>, OtherDerived = Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Block<const Eigen::Matrix<double, -1, -1>, -1, 1, true>, const Eigen::Matrix<double, -1, 1>>]"
        ;
        goto LAB_0011df67;
      }
      uVar16 = local_1c8.m_rows - (local_1c8.m_rows >> 0x3f) & 0xfffffffffffffffe;
      if (1 < local_1c8.m_rows) {
        lVar20 = 0;
        do {
          pdVar1 = (double *)(lVar7 * local_1d0 + lVar21 + lVar20 * 8);
          dVar4 = pdVar1[1];
          pdVar8 = (z_pred->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                   m_storage.m_data + lVar20;
          dVar11 = pdVar8[1];
          local_1c8.m_data[lVar20] = *pdVar1 - *pdVar8;
          (local_1c8.m_data + lVar20)[1] = dVar4 - dVar11;
          lVar20 = lVar20 + 2;
        } while (lVar20 < (long)uVar16);
      }
      if ((long)uVar16 < local_1c8.m_rows) {
        pdVar1 = (z_pred->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                 m_data;
        do {
          local_1c8.m_data[uVar16] =
               *(double *)(lVar21 + lVar7 * local_1d0 + uVar16 * 8) - pdVar1[uVar16];
          uVar16 = uVar16 + 1;
        } while (local_1c8.m_rows != uVar16);
      }
      (*this->current_sensor_->_vptr_Sensor[3])(this->current_sensor_,&local_1c8);
      lVar21 = *(long *)local_178;
      lVar7 = *(long *)(local_178 + 8);
      if ((lVar7 < 0) && (lVar21 + lVar7 * lVar15 * 8 != 0)) goto LAB_0011df14;
      if (*(long *)(local_178 + 0x10) <= lVar15) goto LAB_0011def5;
      lVar20 = (x->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
      if (lVar7 != lVar20) goto LAB_0011dede;
      Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage
                ((DenseStorage<double,__1,__1,_1,_0> *)&local_168,lVar20,lVar20,1);
      Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_168,
                 (x->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                 m_rows,1);
      if ((PlainObject *)local_168.m_rows !=
          (PlainObject *)
          (x->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows)
      goto LAB_0011df52;
      pPVar17 = (PlainObject *)(local_168.m_rows - (local_168.m_rows >> 0x3f) & 0xfffffffffffffffe);
      if (1 < local_168.m_rows) {
        lVar20 = 0;
        do {
          pdVar1 = (double *)(lVar7 * local_1d0 + lVar21 + lVar20 * 8);
          dVar4 = pdVar1[1];
          pdVar8 = (x->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                   m_data + lVar20;
          dVar11 = pdVar8[1];
          ppdVar2 = &(((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                      local_168.m_data)->m_storage).m_data + lVar20;
          *ppdVar2 = (double *)(*pdVar1 - *pdVar8);
          ppdVar2[1] = (double *)(dVar4 - dVar11);
          lVar20 = lVar20 + 2;
        } while (lVar20 < (long)pPVar17);
      }
      if ((long)pPVar17 < local_168.m_rows) {
        pdVar1 = (x->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                 m_data;
        do {
          (&(((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_168.m_data)->
            m_storage).m_data)[(long)pPVar17] =
               (double *)
               (*(double *)(lVar21 + lVar7 * local_1d0 + (long)pPVar17 * 8) - pdVar1[(long)pPVar17])
          ;
          pPVar17 = (PlainObject *)
                    ((long)&(pPVar17->
                            super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                            m_storage.m_data + 1);
        } while ((PlainObject *)local_168.m_rows != pPVar17);
      }
      NormalizeState(this,(VectorXd *)&local_168);
      if ((this->weights_c_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
          m_storage.m_rows <= lVar15) {
        __assert_fail("index >= 0 && index < size()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/overtane[P]udacity-carnd-p7/src/Eigen/src/Core/DenseCoeffsBase.h"
                      ,0xad,
                      "CoeffReturnType Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 0>::operator()(Index) const [Derived = Eigen::Matrix<double, -1, 1>, Level = 0]"
                     );
      }
      local_120._8_8_ =
           (this->weights_c_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
           m_storage.m_data[lVar15];
      local_120._16_8_ = &local_1c8;
      pcStack_108 = (complex<double> *)0x0;
      pdStack_100 = (double *)0x0;
      local_f8 = 0;
      local_150.
      super_ProductBase<Eigen::GeneralProduct<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_5>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
      .m_lhs = (LhsNested)pDVar3;
      local_120._0_8_ = &local_168;
      local_150.
      super_ProductBase<Eigen::GeneralProduct<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_5>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
      .m_rhs = Eigen::ProductBase::operator_cast_to_Matrix_((ProductBase *)local_120);
      if (((DenseStorage<double,__1,__1,__1,_0> *)local_198.m_rows !=
           *(DenseStorage<double,__1,__1,__1,_0> **)(local_120._0_8_ + 8)) ||
         ((Nested)local_198.m_cols != *(Nested *)(local_120._16_8_ + 8))) {
        pcVar19 = 
        "Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Matrix<double, -1, -1>, const Eigen::GeneralProduct<Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>, const Eigen::Matrix<double, -1, 1>>, Eigen::Transpose<Eigen::Matrix<double, -1, 1>>, 2>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_sum_op<double>, Lhs = const Eigen::Matrix<double, -1, -1>, Rhs = const Eigen::GeneralProduct<Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>, const Eigen::Matrix<double, -1, 1>>, Eigen::Transpose<Eigen::Matrix<double, -1, 1>>, 2>]"
        ;
        goto LAB_0011df48;
      }
      Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
      lazyAssign<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const,Eigen::GeneralProduct<Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>,Eigen::Transpose<Eigen::Matrix<double,_1,1,0,_1,1>>,2>const>>
                ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)pDVar3,
                 (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::GeneralProduct<Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_2>_>_>
                  *)&local_150);
      free(pcStack_108);
      free(local_168.m_data);
      free(local_1c8.m_data);
      lVar15 = lVar15 + 1;
      local_1d0 = local_1d0 + 8;
    } while (lVar15 < this->n_sigma_);
  }
  pDVar3 = local_128;
  if (local_128->m_rows != local_128->m_cols) goto LAB_0011dfa7;
  local_150.
  super_ProductBase<Eigen::GeneralProduct<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_5>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
  .m_lhs = (LhsNested)local_128;
  Eigen::
  ProductBase<Eigen::GeneralProduct<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::ReturnByValue<Eigen::internal::inverse_impl<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>,_5>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::ReturnByValue<Eigen::internal::inverse_impl<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>_>
  ::ProductBase((ProductBase<Eigen::GeneralProduct<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::ReturnByValue<Eigen::internal::inverse_impl<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_5>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::ReturnByValue<Eigen::internal::inverse_impl<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>
                 *)local_120,(Matrix<double,__1,__1,_0,__1,__1> *)(local_1a8 + 0x10),
                (ReturnByValue<Eigen::internal::inverse_impl<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                 *)&local_150);
  other = (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
          Eigen::ProductBase::operator_cast_to_Matrix_((ProductBase *)local_120);
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::DenseStorage
            (&local_1c8,*(long *)(other + 0x10) * *(long *)(other + 8),*(long *)(other + 8),
             *(long *)(other + 0x10));
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  lazyAssign<Eigen::Matrix<double,_1,_1,0,_1,_1>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_1c8,other);
  free(pdStack_100);
  free((void *)local_120._8_8_);
  lVar15 = (z_pred->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows
  ;
  if ((local_1b0->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows
      != lVar15) {
    pcVar19 = 
    "Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_difference_op<double>, Lhs = const Eigen::Matrix<double, -1, 1>, Rhs = const Eigen::Matrix<double, -1, 1>]"
    ;
LAB_0011df48:
    __assert_fail("aLhs.rows() == aRhs.rows() && aLhs.cols() == aRhs.cols()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/overtane[P]udacity-carnd-p7/src/Eigen/src/Core/CwiseBinaryOp.h"
                  ,0x84,pcVar19);
  }
  Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage
            ((DenseStorage<double,__1,__1,_1,_0> *)local_1a8,lVar15,lVar15,1);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_1a8,
             (z_pred->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
             m_rows,1);
  if (local_1a8._8_8_ !=
      (z_pred->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows) {
    pcVar19 = 
    "Derived &Eigen::DenseBase<Eigen::Matrix<double, -1, 1>>::lazyAssign(const DenseBase<OtherDerived> &) [Derived = Eigen::Matrix<double, -1, 1>, OtherDerived = Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>]"
    ;
LAB_0011df67:
    __assert_fail("rows() == other.rows() && cols() == other.cols()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/overtane[P]udacity-carnd-p7/src/Eigen/src/Core/Assign.h"
                  ,0x1f9,pcVar19);
  }
  uVar16 = local_1a8._8_8_ - ((long)local_1a8._8_8_ >> 0x3f) & 0xfffffffffffffffe;
  if (1 < (long)local_1a8._8_8_) {
    lVar15 = 0;
    do {
      pdVar1 = (local_1b0->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
               m_storage.m_data + lVar15;
      dVar4 = pdVar1[1];
      pdVar8 = (z_pred->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
               m_data + lVar15;
      dVar11 = pdVar8[1];
      *(double *)(local_1a8._0_8_ + lVar15 * 8) = *pdVar1 - *pdVar8;
      ((double *)(local_1a8._0_8_ + lVar15 * 8))[1] = dVar4 - dVar11;
      lVar15 = lVar15 + 2;
    } while (lVar15 < (long)uVar16);
  }
  if ((long)uVar16 < (long)local_1a8._8_8_) {
    pdVar1 = (local_1b0->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage
             .m_data;
    pdVar8 = (z_pred->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
             m_data;
    do {
      *(double *)(local_1a8._0_8_ + uVar16 * 8) = pdVar1[uVar16] - pdVar8[uVar16];
      uVar16 = uVar16 + 1;
    } while (local_1a8._8_8_ != uVar16);
  }
  (*this->current_sensor_->_vptr_Sensor[3])(this->current_sensor_,(Nested)local_1a8);
  local_120._16_8_ = (DenseStorage<double,__1,__1,__1,_0> *)0x0;
  pcStack_108 = (complex<double> *)0x0;
  local_120._0_8_ = &local_1c8;
  local_120._8_8_ = (Nested)local_1a8;
  if (local_1c8.m_cols != local_1a8._8_8_) {
    pcVar19 = 
    "Eigen::ProductBase<Eigen::GeneralProduct<Eigen::Matrix<double, -1, -1>, Eigen::Matrix<double, -1, 1>, 4>, Eigen::Matrix<double, -1, -1>, Eigen::Matrix<double, -1, 1>>::ProductBase(const Lhs &, const Rhs &) [Derived = Eigen::GeneralProduct<Eigen::Matrix<double, -1, -1>, Eigen::Matrix<double, -1, 1>, 4>, Lhs = Eigen::Matrix<double, -1, -1>, Rhs = Eigen::Matrix<double, -1, 1>]"
    ;
LAB_0011e098:
    __assert_fail("a_lhs.cols() == a_rhs.rows() && \"invalid matrix product\" && \"if you wanted a coeff-wise or a dot product use the respective explicit functions\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/overtane[P]udacity-carnd-p7/src/Eigen/src/Core/ProductBase.h"
                  ,0x66,pcVar19);
  }
  pPVar12 = Eigen::ProductBase::operator_cast_to_Matrix_((ProductBase *)local_120);
  if ((x->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows !=
      *(DenseIndex *)(local_120._0_8_ + 8)) {
    pcVar19 = 
    "Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::GeneralProduct<Eigen::Matrix<double, -1, -1>, Eigen::Matrix<double, -1, 1>, 4>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_sum_op<double>, Lhs = const Eigen::Matrix<double, -1, 1>, Rhs = const Eigen::GeneralProduct<Eigen::Matrix<double, -1, -1>, Eigen::Matrix<double, -1, 1>, 4>]"
    ;
    goto LAB_0011df48;
  }
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            (&x->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,
             (pPVar12->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
             m_rows,1);
  uVar16 = (x->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
  if (uVar16 != (pPVar12->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                m_rows) {
    pcVar19 = 
    "Derived &Eigen::DenseBase<Eigen::Matrix<double, -1, 1>>::lazyAssign(const DenseBase<OtherDerived> &) [Derived = Eigen::Matrix<double, -1, 1>, OtherDerived = Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::GeneralProduct<Eigen::Matrix<double, -1, -1>, Eigen::Matrix<double, -1, 1>, 4>>]"
    ;
    goto LAB_0011df67;
  }
  uVar18 = uVar16 - ((long)uVar16 >> 0x3f) & 0xfffffffffffffffe;
  if (1 < (long)uVar16) {
    lVar15 = 0;
    do {
      pdVar9 = (x->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
      pdVar1 = pdVar9 + lVar15;
      dVar11 = pdVar1[1];
      pdVar8 = (pPVar12->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
               m_data + lVar15;
      dVar4 = pdVar8[1];
      pdVar9 = pdVar9 + lVar15;
      *pdVar9 = *pdVar1 + *pdVar8;
      pdVar9[1] = dVar11 + dVar4;
      lVar15 = lVar15 + 2;
    } while (lVar15 < (long)uVar18);
  }
  if ((long)uVar18 < (long)uVar16) {
    pdVar1 = (x->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
    pdVar8 = (pPVar12->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
             m_data;
    do {
      pdVar1[uVar18] = pdVar1[uVar18] + pdVar8[uVar18];
      uVar18 = uVar18 + 1;
    } while (uVar16 != uVar18);
  }
  free((void *)local_120._16_8_);
  NormalizeState(this,x);
  local_150.
  super_ProductBase<Eigen::GeneralProduct<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_5>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
  .m_rhs = (RhsNested)pDVar3;
  local_150.
  super_ProductBase<Eigen::GeneralProduct<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_5>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
  .m_result.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       (double *)0x0;
  local_150.
  super_ProductBase<Eigen::GeneralProduct<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_5>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
  .m_result.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows = 0;
  local_150.
  super_ProductBase<Eigen::GeneralProduct<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_5>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
  .m_result.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols = 0;
  local_150.
  super_ProductBase<Eigen::GeneralProduct<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_5>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
  .m_lhs = (LhsNested)&local_1c8;
  if (local_1c8.m_cols != pDVar3->m_rows) {
    pcVar19 = 
    "Eigen::ProductBase<Eigen::GeneralProduct<Eigen::Matrix<double, -1, -1>, Eigen::Matrix<double, -1, -1>, 5>, Eigen::Matrix<double, -1, -1>, Eigen::Matrix<double, -1, -1>>::ProductBase(const Lhs &, const Rhs &) [Derived = Eigen::GeneralProduct<Eigen::Matrix<double, -1, -1>, Eigen::Matrix<double, -1, -1>, 5>, Lhs = Eigen::Matrix<double, -1, -1>, Rhs = Eigen::Matrix<double, -1, -1>]"
    ;
    goto LAB_0011e098;
  }
  local_38.m_matrix = (Nested)&local_1c8;
  Eigen::
  ProductBase<Eigen::GeneralProduct<Eigen::GeneralProduct<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_5>,_Eigen::Transpose<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_5>,_Eigen::GeneralProduct<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_5>,_Eigen::Transpose<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
  ::ProductBase((ProductBase<Eigen::GeneralProduct<Eigen::GeneralProduct<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_5>,_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_5>,_Eigen::GeneralProduct<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_5>,_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                 *)local_120,&local_150,&local_38);
  local_168.m_data = (double *)P;
  local_168.m_rows =
       (DenseIndex)Eigen::ProductBase::operator_cast_to_Matrix_((ProductBase *)local_120);
  if (((P->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows !=
       *(DenseIndex *)(local_120._0_8_ + 8)) ||
     ((P->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_cols !=
      (((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_120._8_8_)->m_storage).
      m_rows)) {
    pcVar19 = 
    "Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, -1>, const Eigen::GeneralProduct<Eigen::GeneralProduct<Eigen::Matrix<double, -1, -1>, Eigen::Matrix<double, -1, -1>, 5>, Eigen::Transpose<Eigen::Matrix<double, -1, -1>>, 5>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_difference_op<double>, Lhs = const Eigen::Matrix<double, -1, -1>, Rhs = const Eigen::GeneralProduct<Eigen::GeneralProduct<Eigen::Matrix<double, -1, -1>, Eigen::Matrix<double, -1, -1>, 5>, Eigen::Transpose<Eigen::Matrix<double, -1, -1>>, 5>]"
    ;
    goto LAB_0011df48;
  }
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  lazyAssign<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const,Eigen::GeneralProduct<Eigen::GeneralProduct<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,_1,0,_1,_1>,5>,Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>,5>const>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)P,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::GeneralProduct<Eigen::GeneralProduct<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_5>,_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_5>_>_>
              *)&local_168);
  free((void *)local_120._16_8_);
  free(local_150.
       super_ProductBase<Eigen::GeneralProduct<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_5>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
       .m_result.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data);
  if (1 < this->debug_) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Update done:",0xc);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x30);
    std::ostream::put(-0x30);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"z:\n",3);
    local_120._0_8_ = local_1b0;
    poVar13 = Eigen::operator<<((ostream *)&std::cout,
                                (DenseBase<Eigen::Transpose<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                 *)local_120);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar13 + -0x18) + (char)poVar13);
    std::ostream::put((char)poVar13);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"z_pred:\n",8);
    local_120._0_8_ = z_pred;
    poVar13 = Eigen::operator<<((ostream *)&std::cout,
                                (DenseBase<Eigen::Transpose<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                 *)local_120);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar13 + -0x18) + (char)poVar13);
    std::ostream::put((char)poVar13);
    std::ostream::flush();
    *(uint *)(std::runtime_error::runtime_error + *(long *)(std::cout + -0x18)) =
         *(uint *)(std::runtime_error::runtime_error + *(long *)(std::cout + -0x18)) & 0xfffffefb |
         4;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Xsig_pred:\n",0xb);
    poVar13 = Eigen::operator<<((ostream *)&std::cout,local_178);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar13 + -0x18) + (char)poVar13);
    std::ostream::put((char)poVar13);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Zsig:\n",6);
    poVar13 = Eigen::operator<<((ostream *)&std::cout,local_170);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar13 + -0x18) + (char)poVar13);
    std::ostream::put((char)poVar13);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Tc:\n",4);
    poVar13 = Eigen::operator<<((ostream *)&std::cout,
                                (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                                (local_1a8 + 0x10));
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar13 + -0x18) + (char)poVar13);
    std::ostream::put((char)poVar13);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"S:\n",3);
    poVar13 = Eigen::operator<<((ostream *)&std::cout,
                                (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)pDVar3);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar13 + -0x18) + (char)poVar13);
    std::ostream::put((char)poVar13);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"S inverse:\n",0xb);
    if (pDVar3->m_rows == pDVar3->m_cols) {
      local_120._0_8_ = pDVar3;
      poVar13 = Eigen::operator<<((ostream *)&std::cout,
                                  (DenseBase<Eigen::ReturnByValue<Eigen::internal::inverse_impl<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>
                                   *)local_120);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar13 + -0x18) + (char)poVar13);
      std::ostream::put((char)poVar13);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"K:\n",3);
      poVar13 = Eigen::operator<<((ostream *)&std::cout,
                                  (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&local_1c8
                                 );
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar13 + -0x18) + (char)poVar13);
      std::ostream::put((char)poVar13);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"K transpose:\n",0xd)
      ;
      local_120._0_8_ = &local_1c8;
      poVar13 = Eigen::operator<<((ostream *)&std::cout,
                                  (DenseBase<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                                   *)local_120);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar13 + -0x18) + (char)poVar13);
      std::ostream::put((char)poVar13);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"P:\n",3);
      poVar13 = Eigen::operator<<((ostream *)&std::cout,
                                  (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)P);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar13 + -0x18) + (char)poVar13);
      std::ostream::put((char)poVar13);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"P inverse:\n",0xb);
      if ((P->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows ==
          (P->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_cols) {
        local_120._0_8_ = P;
        poVar13 = Eigen::operator<<((ostream *)&std::cout,
                                    (DenseBase<Eigen::ReturnByValue<Eigen::internal::inverse_impl<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>
                                     *)local_120);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar13 + -0x18) + (char)poVar13);
        std::ostream::put((char)poVar13);
        std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"x:\n",3);
        local_120._0_8_ = x;
        poVar13 = Eigen::operator<<((ostream *)&std::cout,
                                    (DenseBase<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                     *)local_120);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar13 + -0x18) + (char)poVar13);
        std::ostream::put((char)poVar13);
        std::ostream::flush();
        Eigen::EigenSolver<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::EigenSolver
                  ((EigenSolver<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_120,P,true);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Eigenvalues of P:\n",0x12);
        if (local_f8._0_1_ == false) {
          __assert_fail("m_isInitialized && \"EigenSolver is not initialized.\"",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/overtane[P]udacity-carnd-p7/src/Eigen/src/Eigenvalues/EigenSolver.h"
                        ,0xf5,
                        "const EigenvalueType &Eigen::EigenSolver<Eigen::Matrix<double, -1, -1>>::eigenvalues() const [_MatrixType = Eigen::Matrix<double, -1, -1>]"
                       );
        }
        poVar13 = Eigen::operator<<((ostream *)&std::cout,
                                    (DenseBase<Eigen::Matrix<std::complex<double>,__1,_1,_0,__1,_1>_>
                                     *)&pcStack_108);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar13 + -0x18) + (char)poVar13);
        std::ostream::put((char)poVar13);
        std::ostream::flush();
        free(local_48);
        free(local_60);
        free(local_88);
        free(local_98);
        free(local_b0);
        free(local_c0);
        free(local_d8);
        free(local_f0);
        free(pcStack_108);
        free((void *)local_120._0_8_);
        goto LAB_0011deae;
      }
    }
LAB_0011dfa7:
    __assert_fail("rows() == cols()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/overtane[P]udacity-carnd-p7/src/Eigen/src/LU/Inverse.h"
                  ,0x143,
                  "const internal::inverse_impl<Derived> Eigen::MatrixBase<Eigen::Matrix<double, -1, -1>>::inverse() const [Derived = Eigen::Matrix<double, -1, -1>]"
                 );
  }
LAB_0011deae:
  free((void *)local_1a8._0_8_);
  free(local_1c8.m_data);
  free(local_198.m_data);
  return;
}

Assistant:

void UnscentedKalmanFilter::UpdateState(const VectorXd &z, const VectorXd &z_pred, const MatrixXd &S, 
		const MatrixXd &Xsig_pred, const MatrixXd &Zsig, VectorXd &x, MatrixXd &P) const {

   int n_z = z_pred.rows();	
   int n_x = x.rows();

   // calculate cross correlation matrix
   MatrixXd Tc(n_x, n_z);

   Tc.fill(0.0);

   for (int i=0; i<n_sigma_; i++) {  // 2n+1 sigma points

       // residual
       VectorXd z_diff = Zsig.col(i) - z_pred;
       current_sensor_->NormalizeMeasurement(z_diff);

       // state difference
       VectorXd x_diff = Xsig_pred.col(i) - x;
       NormalizeState(x_diff);

       Tc = Tc + weights_c_(i) * x_diff * z_diff.transpose();
   }

   // Kalman gain K;
   MatrixXd K = Tc * S.inverse();

   // residual
   VectorXd z_diff = z - z_pred;
   current_sensor_->NormalizeMeasurement(z_diff);

   // update state mean and covariance matrix
   x = x + K * z_diff;
   NormalizeState(x);
   P = P - K*S*K.transpose();

   if (debug_ > 1) {
       std::cout << "Update done:" << endl;
       std::cout << "z:\n" << z.transpose() << std::endl;
       std::cout << "z_pred:\n" << z_pred.transpose() << std::endl;
       std::cout << std::fixed << "Xsig_pred:\n" << Xsig_pred << std::endl;
       std::cout << "Zsig:\n" << Zsig << std::endl;
       std::cout << "Tc:\n" << Tc << std::endl;
       std::cout << "S:\n" << S << std::endl;
       std::cout << "S inverse:\n" << S.inverse() << std::endl;
       std::cout << "K:\n" << K << std::endl;
       std::cout << "K transpose:\n" << K.transpose() << std::endl;
       std::cout << "P:\n" << P << std::endl;
       std::cout << "P inverse:\n" << P.inverse() << std::endl;
       std::cout << "x:\n" << x.transpose() << std::endl;
       Eigen::EigenSolver<MatrixXd> es(P);
       cout << "Eigenvalues of P:\n" << es.eigenvalues() << endl;
    }
}